

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

size_t __thiscall
MemoryLeakDetectorTable::getTotalLeaks(MemoryLeakDetectorTable *this,MemLeakPeriod period)

{
  size_t sVar1;
  int local_24;
  size_t sStack_20;
  int i;
  size_t total_leaks;
  MemLeakPeriod period_local;
  MemoryLeakDetectorTable *this_local;
  
  sStack_20 = 0;
  for (local_24 = 0; local_24 < 0x49; local_24 = local_24 + 1) {
    sVar1 = MemoryLeakDetectorList::getTotalLeaks(this->table_ + local_24,period);
    sStack_20 = sVar1 + sStack_20;
  }
  return sStack_20;
}

Assistant:

size_t MemoryLeakDetectorTable::getTotalLeaks(MemLeakPeriod period)
{
    size_t total_leaks = 0;
    for (int i = 0; i < hash_prime; i++)
        total_leaks += table_[i].getTotalLeaks(period);
    return total_leaks;
}